

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
openjij::test::RESULT_GetSolutionFromTrotter_Test::~RESULT_GetSolutionFromTrotter_Test
          (RESULT_GetSolutionFromTrotter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RESULT, GetSolutionFromTrotter){
   auto graph = openjij::graph::Dense<float>(4);
   graph.J(1, 1) = -1.0;
   graph.J(0, 1) = -1.0;
   graph.J(1, 2) = -1.0;
   graph.J(2, 3) = 1.0;
   
   auto r = openjij::utility::Xorshift(1234);
   int num_trotter_slices = 4;
   openjij::system::TrotterSpins init_trotter_spins(num_trotter_slices);
   for(auto& spins : init_trotter_spins){
      spins = graph.gen_spin(r);
   }
   
   init_trotter_spins[0] = openjij::graph::Spins({1, 1, 1, -1});
   
   auto q_sys = openjij::system::make_transverse_ising(init_trotter_spins, graph, 1.0);
   // get_solution get minimum energy state
   auto solution = openjij::result::get_solution(q_sys);
   EXPECT_EQ(solution, init_trotter_spins[0]);
}